

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::append(QString *this,QLatin1StringView str)

{
  QLatin1 *this_00;
  char16_t *pcVar1;
  char *pcVar2;
  qsizetype qVar3;
  difference_type __d;
  char16_t *out;
  QLatin1StringView other;
  QLatin1StringView in;
  
  in.m_size = str.m_data;
  out = (char16_t *)str.m_size;
  if ((long)out < 1 || in.m_size == (char *)0x0) {
    if ((in.m_size != (char *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      qVar3 = QtPrivate::lengthHelperPointer<char>("");
      other.m_data = "";
      other.m_size = qVar3;
      operator=(this,other);
    }
  }
  else {
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,(qsizetype)out,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    pcVar1 = (this->d).ptr;
    if (pcVar1 == (char16_t *)0x0) {
      qBadAlloc();
    }
    pcVar2 = (char *)(this->d).size;
    this_00 = (QLatin1 *)(pcVar1 + (long)pcVar2);
    in.m_data = pcVar2;
    QLatin1::convertToUnicode(this_00,out,in);
    resize(this,(long)(this_00 + ((long)out * 2 - (long)(this->d).ptr)) >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QLatin1StringView str)
{
    append_helper(*this, str);
    return *this;
}